

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O1

bool __thiscall FileTest::fillFile(FileTest *this,File *f)

{
  int i;
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  undefined1 local_128 [264];
  
  lVar2 = 0;
  do {
    local_128[lVar2] = (char)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  local_128[0] = 0;
  iVar1 = (**(code **)(*(long *)f + 0x18))(f,local_128,0x100);
  uVar4 = 0;
  if (iVar1 == 0x100) {
    do {
      uVar3 = uVar4;
      if (uVar3 == 5) break;
      local_128[0] = (undefined1)(uVar3 + 1);
      iVar1 = (**(code **)(*(long *)f + 0x18))(f,local_128,0x100);
      uVar4 = uVar3 + 1;
    } while (iVar1 == 0x100);
    uVar4 = (uint)(4 < uVar3);
  }
  return SUB41(uVar4,0);
}

Assistant:

bool FileTest::fillFile( File &f )
{
	uint8_t buffer[ 256 ];
	
	for ( int i = 0; i < 256; i++ )
		buffer[ i ] = i;
	
	for ( int i = 0; i < 6; i++ )
	{
		buffer[ 0 ] = i;

		int res = f.write( buffer, 256 );
		
		if ( res != 256 )
			return false;
	}
	return true;
}